

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

bool __thiscall
clipp::parser::try_match_joined_sequence<clipp::detail::select_flags>
          (parser *this,arg_string *arg,select_flags *acceptFirst)

{
  type tVar1;
  group *pgVar2;
  bool bVar3;
  child_t<clipp::parameter,_clipp::group> *pcVar4;
  iterator __begin2;
  pointer match;
  subrange sVar5;
  initializer_list<clipp::detail::match_t> __l;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  scoped_dfs_traverser pos;
  match_t fstMatch;
  allocator_type local_309;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> local_308;
  scoped_dfs_traverser local_2f0;
  match_t local_250;
  match_t local_190;
  scoped_dfs_traverser local_d0;
  
  detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_d0,&this->pos_);
  detail::prefix_match<clipp::detail::select_flags>(&local_190,&local_d0,arg,acceptFirst);
  std::
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  *)&local_d0.scopes_);
  if (local_d0.posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.posAfterLastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.lastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.pos_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_190.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_190.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00109935;
  if (local_190.str_._M_string_length == arg->_M_string_length) {
    bVar3 = true;
    add_match(this,&local_190);
    goto LAB_00109937;
  }
  pcVar4 = local_190.pos_.pos_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
  if (pcVar4->type_ == param) {
    if (*(bool *)((long)&pcVar4->m_ + 0x21) == true) goto LAB_001096d0;
  }
  else if ((pcVar4->type_ == group) && (bVar3 = group::blocking((group *)pcVar4), bVar3)) {
LAB_001096d0:
    detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_2f0,&local_190.pos_);
    local_2f0.ignoreBlocks_ = true;
    pgVar2 = local_2f0.pos_.stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].parent;
    pcVar4 = local_2f0.pos_.stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
    tVar1 = pcVar4->type_;
    if (((tVar1 != param) && (tVar1 != group)) || (*(char *)((long)&pcVar4->m_ + 0x20) == '\0')) {
      detail::scoped_dfs_traverser::operator++(&local_2f0);
    }
    std::__cxx11::string::erase((ulong)arg,0);
    detail::match_t::match_t(&local_250,&local_190);
    __l._M_len = 1;
    __l._M_array = &local_250;
    std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::vector
              (&local_308,__l,&local_309);
    std::
    _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
    ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                    *)&local_250.pos_.scopes_);
    if (local_250.pos_.posAfterLastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.pos_.posAfterLastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.pos_.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.pos_.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_250.pos_.lastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.pos_.lastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.pos_.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.pos_.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_250.pos_.pos_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.pos_.pos_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.pos_.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.pos_.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.str_._M_dataplus._M_p != &local_250.str_.field_2) {
      operator_delete(local_250.str_._M_dataplus._M_p,
                      local_250.str_.field_2._M_allocated_capacity + 1);
    }
    if (arg->_M_string_length != 0) {
      do {
        if (local_2f0.pos_.stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_2f0.pos_.stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001099cf:
          if (arg->_M_string_length != 0) goto LAB_00109a01;
          break;
        }
        pcVar4 = local_2f0.pos_.stack_.
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
        if (pcVar4->type_ != param) {
          if (((pcVar4->type_ == group) && (bVar3 = group::blocking((group *)pcVar4), bVar3)) &&
             (pcVar4 = local_2f0.pos_.stack_.
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current,
             pcVar4->type_ == param)) goto LAB_00109844;
          goto LAB_001099cf;
        }
        if (*(bool *)((long)&pcVar4->m_ + 0x21) == false) goto LAB_001099cf;
LAB_00109844:
        if (local_2f0.pos_.stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].parent != pgVar2) goto LAB_001099cf;
        sVar5 = parameter::match((parameter *)pcVar4,arg);
        if (sVar5.at_ == 0) {
          std::__cxx11::string::substr((ulong)&local_250,(ulong)arg);
          std::vector<clipp::detail::match_t,std::allocator<clipp::detail::match_t>>::
          emplace_back<std::__cxx11::string,clipp::detail::scoped_dfs_traverser&>
                    ((vector<clipp::detail::match_t,std::allocator<clipp::detail::match_t>> *)
                     &local_308,&local_250.str_,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250.str_._M_dataplus._M_p != &local_250.str_.field_2) {
            operator_delete(local_250.str_._M_dataplus._M_p,
                            local_250.str_.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::erase((ulong)arg,0);
          pcVar4 = local_2f0.pos_.stack_.
                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
          tVar1 = pcVar4->type_;
          if (((tVar1 != param) && (tVar1 != group)) ||
             (*(char *)((long)&pcVar4->m_ + 0x20) == '\0')) goto LAB_00109913;
        }
        else {
          pcVar4 = local_2f0.pos_.stack_.
                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
          if (pcVar4->type_ == param) {
            if (*(char *)((long)&pcVar4->m_ + 0x20) != '\x01') goto LAB_00109a01;
          }
          else if ((pcVar4->type_ != group) || (*(char *)((long)&pcVar4->m_ + 0x20) == '\0'))
          goto LAB_00109a01;
LAB_00109913:
          detail::scoped_dfs_traverser::operator++(&local_2f0);
        }
      } while (arg->_M_string_length != 0);
    }
    match = local_308.
            super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
            _M_impl.super__Vector_impl_data._M_start;
    if (local_308.
        super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_308.
        super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00109a01:
      bVar3 = false;
    }
    else {
      do {
        add_match(this,match);
        match = match + 1;
      } while (match != local_308.
                        super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      bVar3 = true;
    }
    std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector
              (&local_308);
    std::
    _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
    ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                    *)&local_2f0.scopes_);
    if (local_2f0.posAfterLastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.posAfterLastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f0.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f0.posAfterLastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2f0.lastMatch_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.lastMatch_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f0.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f0.lastMatch_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2f0.pos_.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.pos_.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f0.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f0.pos_.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_00109937;
  }
LAB_00109935:
  bVar3 = false;
LAB_00109937:
  std::
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  *)&local_190.pos_.scopes_);
  if (local_190.pos_.posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.pos_.posAfterLastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.pos_.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.pos_.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_190.pos_.lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.pos_.lastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.pos_.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.pos_.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_190.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.pos_.pos_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.pos_.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.pos_.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.str_._M_dataplus._M_p != &local_190.str_.field_2) {
    operator_delete(local_190.str_._M_dataplus._M_p,local_190.str_.field_2._M_allocated_capacity + 1
                   );
  }
  return bVar3;
}

Assistant:

bool try_match_joined_sequence(arg_string arg,
                                   const ParamSelector& acceptFirst)
    {
        auto fstMatch = detail::prefix_match(pos_, arg, acceptFirst);

        if(!fstMatch) return false;

        if(fstMatch.str().size() == arg.size()) {
            add_match(fstMatch);
            return true;
        }

        if(!fstMatch.pos()->blocking()) return false;

        auto pos = fstMatch.pos();
        pos.ignore_blocking(true);
        const auto parent = &pos.parent();
        if(!pos->repeatable()) ++pos;

        arg.erase(0, fstMatch.str().size());
        std::vector<match_t> matches { std::move(fstMatch) };

        while(!arg.empty() && pos &&
              pos->blocking() && pos->is_param() &&
              (&pos.parent() == parent))
        {
            auto match = pos->as_param().match(arg);

            if(match.prefix()) {
                matches.emplace_back(arg.substr(0,match.length()), pos);
                arg.erase(0, match.length());
                if(!pos->repeatable()) ++pos;
            }
            else {
                if(!pos->repeatable()) return false;
                ++pos;
            }

        }
        //if arg not fully covered => discard temporary matches
        if(!arg.empty() || matches.empty()) return false;

        for(const auto& m : matches) add_match(m);
        return true;
    }